

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrsv.c
# Opt level: O3

void dtrsv_(char *uplo,char *trans,char *diag,integer *n,doublereal *a,integer *lda,doublereal *x,
           integer *incx)

{
  char cVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  doublereal *pdVar7;
  double *pdVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  doublereal *pdVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  double dVar25;
  int local_44;
  ulong local_40;
  
  cVar1 = *uplo;
  if ((cVar1 == 'L') || (cVar1 == 'U')) {
    uVar5 = (byte)*trans - 0x43;
    if ((uVar5 < 0x12) && ((0x20801U >> (uVar5 & 0x1f) & 1) != 0)) {
      cVar2 = *diag;
      if ((cVar2 == 'N') || (cVar2 == 'U')) {
        uVar5 = *n;
        uVar13 = (ulong)uVar5;
        if ((int)uVar5 < 0) {
          local_44 = 4;
        }
        else {
          iVar3 = *lda;
          local_40 = (ulong)iVar3;
          uVar6 = 1;
          if (1 < uVar5) {
            uVar6 = uVar5;
          }
          if (iVar3 < (int)uVar6) {
            local_44 = 6;
          }
          else {
            iVar10 = *incx;
            lVar15 = (long)iVar10;
            if (lVar15 != 0) {
              if (uVar13 == 0) {
                return;
              }
              iVar18 = iVar10 * (uVar5 - 1);
              iVar9 = 1 - iVar18;
              if (0 < iVar10) {
                iVar9 = 1;
              }
              if (*trans != 0x4e) {
                if (cVar1 != 'U') {
                  if (iVar10 == 1) {
                    pdVar7 = a + (uVar13 - 1) * local_40 + -1;
                    uVar23 = uVar13;
                    do {
                      dVar25 = x[uVar23 - 1];
                      for (uVar20 = uVar13; (long)uVar23 < (long)uVar20; uVar20 = uVar20 - 1) {
                        dVar25 = dVar25 - pdVar7[uVar20] * x[uVar20 - 1];
                      }
                      uVar20 = uVar23 - 1;
                      if (cVar2 == 'N') {
                        dVar25 = dVar25 / a[(iVar3 + 1) * (int)uVar20];
                      }
                      x[uVar20] = dVar25;
                      pdVar7 = pdVar7 + -local_40;
                      bVar4 = 1 < (long)uVar23;
                      uVar23 = uVar20;
                    } while (bVar4);
                    return;
                  }
                  pdVar7 = a + (uVar13 - 1) * local_40 + -1;
                  uVar23 = uVar13;
                  iVar21 = iVar9 + iVar18;
                  do {
                    dVar25 = x[(long)iVar21 + -1];
                    iVar22 = iVar9 + iVar18;
                    for (uVar20 = uVar13; (long)uVar23 < (long)uVar20; uVar20 = uVar20 - 1) {
                      dVar25 = dVar25 - pdVar7[uVar20] * x[(long)iVar22 + -1];
                      iVar22 = iVar22 - iVar10;
                    }
                    if (cVar2 == 'N') {
                      dVar25 = dVar25 / a[(iVar3 + 1) * (int)(uVar23 - 1)];
                    }
                    x[(long)iVar21 + -1] = dVar25;
                    iVar21 = iVar21 - iVar10;
                    pdVar7 = pdVar7 + -local_40;
                    bVar4 = 1 < (long)uVar23;
                    uVar23 = uVar23 - 1;
                  } while (bVar4);
                  return;
                }
                if (iVar10 == 1) {
                  uVar23 = 1;
                  lVar15 = 0;
                  pdVar7 = a;
                  do {
                    dVar25 = x[uVar23 - 1];
                    if (1 < uVar23) {
                      lVar12 = 0;
                      do {
                        dVar25 = dVar25 - pdVar7[lVar12] * x[lVar12];
                        lVar12 = lVar12 + 1;
                      } while (lVar15 != lVar12);
                    }
                    if (cVar2 == 'N') {
                      dVar25 = dVar25 / a[((int)uVar23 + -1) * (iVar3 + 1)];
                    }
                    x[uVar23 - 1] = dVar25;
                    uVar23 = uVar23 + 1;
                    pdVar7 = pdVar7 + local_40;
                    lVar15 = lVar15 + 1;
                  } while (uVar23 != uVar13 + 1);
                  return;
                }
                lVar17 = (long)iVar9;
                lVar12 = lVar17 + -1;
                uVar23 = 1;
                lVar24 = 0;
                pdVar7 = a;
                do {
                  dVar25 = x[lVar17 + -1];
                  if (1 < uVar23) {
                    lVar11 = 0;
                    pdVar14 = x + lVar12;
                    do {
                      dVar25 = dVar25 - pdVar7[lVar11] * *pdVar14;
                      lVar11 = lVar11 + 1;
                      pdVar14 = pdVar14 + lVar15;
                    } while (lVar24 != lVar11);
                  }
                  if (cVar2 == 'N') {
                    dVar25 = dVar25 / a[((int)uVar23 + -1) * (iVar3 + 1)];
                  }
                  x[lVar17 + -1] = dVar25;
                  lVar17 = lVar17 + lVar15;
                  uVar23 = uVar23 + 1;
                  pdVar7 = pdVar7 + local_40;
                  lVar24 = lVar24 + 1;
                } while (uVar23 != uVar13 + 1);
                return;
              }
              if (cVar1 != 'U') {
                if (iVar10 == 1) {
                  uVar20 = 1;
                  pdVar7 = x;
                  uVar23 = uVar13;
                  pdVar19 = a;
                  do {
                    dVar25 = x[uVar20 - 1];
                    if ((dVar25 != 0.0) || (NAN(dVar25))) {
                      if (cVar2 == 'N') {
                        dVar25 = dVar25 / a[((int)uVar20 + -1) * (iVar3 + 1)];
                        x[uVar20 - 1] = dVar25;
                      }
                      if (uVar20 < uVar13) {
                        uVar16 = 1;
                        do {
                          pdVar7[uVar16] = pdVar19[uVar16] * -dVar25 + pdVar7[uVar16];
                          uVar16 = uVar16 + 1;
                        } while (uVar23 != uVar16);
                      }
                    }
                    uVar20 = uVar20 + 1;
                    pdVar19 = pdVar19 + local_40 + 1;
                    pdVar7 = pdVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (uVar20 != uVar13 + 1);
                  return;
                }
                lVar17 = (long)iVar9;
                lVar12 = uVar13 + 1;
                pdVar14 = x + lVar17 + lVar15 + -1;
                lVar24 = 1;
                iVar10 = 0;
                pdVar7 = a;
                do {
                  dVar25 = x[lVar17 + -1];
                  if ((dVar25 != 0.0) || (NAN(dVar25))) {
                    if (cVar2 == 'N') {
                      dVar25 = dVar25 / a[((int)lVar24 + -1) * (iVar3 + 1)];
                      x[lVar17 + -1] = dVar25;
                    }
                    if ((int)lVar24 < (int)uVar5) {
                      uVar23 = 1;
                      pdVar8 = pdVar14;
                      do {
                        *pdVar8 = pdVar7[(long)iVar10 + uVar23] * -dVar25 + *pdVar8;
                        uVar23 = uVar23 + 1;
                        pdVar8 = pdVar8 + lVar15;
                      } while (uVar13 != uVar23);
                    }
                  }
                  lVar17 = lVar17 + lVar15;
                  lVar24 = lVar24 + 1;
                  pdVar7 = pdVar7 + 1;
                  iVar10 = iVar10 + iVar3;
                  uVar13 = uVar13 - 1;
                  pdVar14 = pdVar14 + lVar15;
                } while (lVar24 != lVar12);
                return;
              }
              if (iVar10 == 1) {
                pdVar7 = a + (uVar13 - 1) * local_40 + (uVar13 - 2);
                pdVar19 = x + (uVar13 - 2);
                do {
                  uVar23 = uVar13 - 1;
                  dVar25 = x[uVar13 - 1];
                  if ((dVar25 != 0.0) || (NAN(dVar25))) {
                    if (cVar2 == 'N') {
                      dVar25 = dVar25 / a[(iVar3 + 1) * (int)uVar23];
                      x[uVar23] = dVar25;
                    }
                    if (uVar13 < 2) {
                      return;
                    }
                    lVar15 = 0;
                    do {
                      pdVar19[lVar15] = pdVar7[lVar15] * -dVar25 + pdVar19[lVar15];
                      lVar12 = uVar13 + lVar15;
                      lVar15 = lVar15 + -1;
                    } while (1 < lVar12 + -1);
                  }
                  pdVar7 = pdVar7 + ~local_40;
                  pdVar19 = pdVar19 + -1;
                  bVar4 = (long)uVar13 < 2;
                  uVar13 = uVar23;
                  if (bVar4) {
                    return;
                  }
                } while( true );
              }
              iVar18 = iVar18 + iVar9;
              iVar21 = (uVar5 - 1) * iVar3;
              iVar9 = (uVar5 - 2) * iVar10 + iVar9;
              do {
                dVar25 = x[(long)iVar18 + -1];
                uVar5 = (uint)uVar13;
                if ((dVar25 != 0.0) || (NAN(dVar25))) {
                  if (cVar2 == 'N') {
                    dVar25 = dVar25 / a[(int)((uVar5 - 1) * (iVar3 + 1))];
                    x[(long)iVar18 + -1] = dVar25;
                  }
                  if (uVar5 < 2) {
                    return;
                  }
                  uVar23 = uVar13;
                  iVar22 = iVar9;
                  do {
                    x[(long)iVar22 + -1] =
                         a[(long)iVar21 + (uVar23 - 2)] * -dVar25 + x[(long)iVar22 + -1];
                    uVar23 = uVar23 - 1;
                    iVar22 = iVar22 - iVar10;
                  } while (1 < (long)uVar23);
                }
                uVar13 = uVar13 - 1;
                iVar18 = iVar18 - iVar10;
                iVar21 = iVar21 - iVar3;
                iVar9 = iVar9 - iVar10;
                if ((int)uVar5 < 2) {
                  return;
                }
              } while( true );
            }
            local_44 = 8;
          }
        }
      }
      else {
        local_44 = 3;
      }
    }
    else {
      local_44 = 2;
    }
  }
  else {
    local_44 = 1;
  }
  input_error("DTRSV ",&local_44);
  return;
}

Assistant:

void dtrsv_(char *uplo, char *trans, char *diag, integer *n, 
	doublereal *a, integer *lda, doublereal *x, integer *incx)
{


    /* System generated locals */

    /* Local variables */
    integer info;
    doublereal temp;
    integer i, j;
    integer ix, jx, kx;
    logical nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    DTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   A'*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - DOUBLE PRECISION array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - DOUBLE PRECISION array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("DTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j) != 0.) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j - 1; i >= 1; --i) {
			    X(i) -= temp * A(i,j);
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx) != 0.) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    X(ix) -= temp * A(i,j);
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j) != 0.) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j + 1; i <= *n; ++i) {
			    X(i) -= temp * A(i,j);
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx) != 0.) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    X(ix) -= temp * A(i,j);
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp = X(j);
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(i);
/* L90: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L100: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(ix);
			ix += *incx;
/* L110: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx += *incx;
/* L120: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp = X(j);
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(i);
/* L130: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L140: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(ix);
			ix -= *incx;
/* L150: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx -= *incx;
/* L160: */
		}
	    }
	}
    }

    return;

/*     End of DTRSV . */

}